

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type __thiscall duckdb::Deserializer::Read<std::pair<double,unsigned_long>>(Deserializer *this)

{
  type tVar1;
  
  (*this->_vptr_Deserializer[6])();
  tVar1.first = ReadProperty<double>(this,0,"first");
  tVar1.second = ReadProperty<unsigned_long>(this,1,"second");
  (*this->_vptr_Deserializer[7])(this);
  return tVar1;
}

Assistant:

inline typename std::enable_if<is_pair<T>::value, T>::type Read() {
		using FIRST_TYPE = typename is_pair<T>::FIRST_TYPE;
		using SECOND_TYPE = typename is_pair<T>::SECOND_TYPE;
		OnObjectBegin();
		auto first = ReadProperty<FIRST_TYPE>(0, "first");
		auto second = ReadProperty<SECOND_TYPE>(1, "second");
		OnObjectEnd();
		return std::make_pair(first, second);
	}